

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

void Bmc_MnaCollect(Gia_Man_t *p,Vec_Int_t *vCos,Vec_Int_t *vNodes,uint *pState)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  uint *pState_local;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vCos_local;
  Gia_Man_t *p_local;
  
  Vec_IntClear(vNodes);
  pGVar3 = Gia_ManConst0(p);
  *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0x7fffffffffffffff | 0x8000000000000000;
  pGVar3 = Gia_ManConst0(p);
  pGVar3->Value = 1;
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vCos);
    bVar4 = false;
    if (local_34 < iVar1) {
      iVar1 = Vec_IntEntry(vCos,local_34);
      pGStack_30 = Gia_ManObj(p,iVar1);
      bVar4 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) {
      return;
    }
    iVar1 = Gia_ObjIsCo(pGStack_30);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                    ,0xa9,
                    "void Bmc_MnaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, unsigned int *)");
    }
    pGVar3 = Gia_ObjFanin0(pGStack_30);
    Bmc_MnaCollect_rec(p,pGVar3,vNodes,pState);
    pGVar3 = Gia_ObjFanin0(pGStack_30);
    uVar2 = pGVar3->Value;
    iVar1 = Gia_ObjFaninC0(pGStack_30);
    uVar2 = Gia_XsimNotCond(uVar2,iVar1);
    pGStack_30->Value = uVar2;
    if (pGStack_30->Value != 3) break;
    local_34 = local_34 + 1;
  }
  __assert_fail("pObj->Value == GIA_UND",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                ,0xac,"void Bmc_MnaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, unsigned int *)");
}

Assistant:

void Bmc_MnaCollect( Gia_Man_t * p, Vec_Int_t * vCos, Vec_Int_t * vNodes, unsigned * pState )
{
    Gia_Obj_t * pObj;
    int i;
    Vec_IntClear( vNodes );
    Gia_ManConst0(p)->fPhase = 1;
    Gia_ManConst0(p)->Value = GIA_ZER;
    Gia_ManForEachObjVec( vCos, p, pObj, i )
    {
        assert( Gia_ObjIsCo(pObj) );
        Bmc_MnaCollect_rec( p, Gia_ObjFanin0(pObj), vNodes, pState );
        pObj->Value = Gia_XsimNotCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
        assert( pObj->Value == GIA_UND );
    }
}